

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexagons.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  _InputArray local_2e0;
  allocator<char> local_2c1;
  string local_2c0 [32];
  _InputArray local_2a0;
  _InputArray local_288;
  Size_<int> local_270;
  _OutputArray local_268;
  _InputArray local_250;
  Mat local_238 [96];
  Scalar_<double> local_1d8;
  Scalar_<double> local_1b8;
  undefined4 local_194;
  int local_190;
  int apiID;
  int deviceID;
  int factorDefault;
  VideoCapture capture;
  undefined1 local_158 [8];
  Mat frame;
  Mat local_f8 [8];
  Mat dstImage;
  Size_<int> local_88;
  Mat local_80 [8];
  Mat imageHexagons;
  Size_<int> local_20;
  Size imageSize;
  char **argv_local;
  int argc_local;
  
  imageSize = (Size)argv;
  cv::Size_<int>::Size_(&local_20,0x5a0,900);
  cv::Size_<int>::Size_(&local_88,&local_20);
  cv::Mat::Mat(local_80,&local_88,0x10);
  bVar1 = cv::Mat::empty();
  if ((bVar1 & 1) == 0) {
    cv::Mat::Mat(local_f8);
    cv::Mat::Mat((Mat *)local_158);
    cv::VideoCapture::VideoCapture((VideoCapture *)&deviceID);
    apiID = 0xb;
    local_190 = 0;
    local_194 = 0;
    cv::VideoCapture::set((int)&deviceID,1440.0);
    cv::VideoCapture::set((int)&deviceID,900.0);
    cv::VideoCapture::open((int)&deviceID,local_190);
    bVar1 = cv::VideoCapture::isOpened();
    if ((bVar1 & 1) == 0) {
      std::operator<<((ostream *)&std::cerr,"ERROR! Unable to open camera\n");
      argv_local._4_4_ = -1;
    }
    else {
      do {
        cv::VideoCapture::operator>>((VideoCapture *)&deviceID,(Mat *)local_158);
        bVar1 = cv::Mat::empty();
        if ((bVar1 & 1) != 0) {
          std::operator<<((ostream *)&std::cerr,"ERROR! blank frame grabbed\n");
          break;
        }
        cv::Scalar_<double>::Scalar_(&local_1b8,0.0,0.0,0.0,0.0);
        cv::Mat::operator=(local_80,(Scalar_ *)&local_1b8);
        cv::Scalar_<double>::Scalar_(&local_1d8,0.0,0.0,0.0,0.0);
        cv::Mat::operator=(local_f8,(Scalar_ *)&local_1d8);
        cv::Mat::Mat(local_238,local_80);
        drawHexagons(local_238,apiID);
        cv::Mat::~Mat(local_238);
        cv::_InputArray::_InputArray(&local_250,(Mat *)local_158);
        cv::_OutputArray::_OutputArray(&local_268,(Mat *)local_158);
        cv::Size_<int>::Size_(&local_270,0x5a0,900);
        cv::resize(0,&local_250,&local_268,&local_270,2);
        cv::_OutputArray::~_OutputArray(&local_268);
        cv::_InputArray::~_InputArray(&local_250);
        cv::_OutputArray::_OutputArray((_OutputArray *)&local_288,local_f8);
        cv::_InputArray::_InputArray(&local_2a0,local_80);
        cv::Mat::copyTo((_OutputArray *)local_158,&local_288);
        cv::_InputArray::~_InputArray(&local_2a0);
        cv::_OutputArray::~_OutputArray((_OutputArray *)&local_288);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_2c0,"Masked",&local_2c1);
        cv::_InputArray::_InputArray(&local_2e0,local_f8);
        cv::imshow(local_2c0,&local_2e0);
        cv::_InputArray::~_InputArray(&local_2e0);
        std::__cxx11::string::~string(local_2c0);
        std::allocator<char>::~allocator(&local_2c1);
        iVar2 = cv::waitKey(5);
      } while (iVar2 < 0);
      argv_local._4_4_ = 0;
    }
    cv::VideoCapture::~VideoCapture((VideoCapture *)&deviceID);
    cv::Mat::~Mat((Mat *)local_158);
    cv::Mat::~Mat(local_f8);
  }
  else {
    std::operator<<((ostream *)&std::cerr,"ERROR! Image cannot be created\n");
    argv_local._4_4_ = -1;
  }
  cv::Mat::~Mat(local_80);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
  Size imageSize(w, h);
  Mat imageHexagons(imageSize, CV_8UC3);

  if (imageHexagons.empty())
  {
    cerr << "ERROR! Image cannot be created\n";
    return -1;
  }

  Mat dstImage, frame;
  VideoCapture capture;
  int factorDefault = 11; // increase/decrease space between hexagons
  int deviceID = 0; // specify your video capture device
  int apiID = cv::CAP_ANY;

  capture.set(VideoCaptureProperties::CAP_PROP_FRAME_WIDTH, w);
  capture.set(VideoCaptureProperties::CAP_PROP_FRAME_HEIGHT, h);

  capture.open(deviceID, apiID);

  if (!capture.isOpened()) {
    cerr << "ERROR! Unable to open camera\n";
    return -1;
  }

  for (;;) {
    capture >> frame;

    if (frame.empty()) {
      cerr << "ERROR! blank frame grabbed\n";
      break;
    }

    imageHexagons = Scalar(0, 0, 0);
    dstImage = Scalar(0, 0, 0);

    drawHexagons(imageHexagons, factorDefault);
    resize(frame, frame, Size(w, h), 0, 0, INTER_CUBIC);
    frame.copyTo(dstImage, imageHexagons);
    imshow("Masked", dstImage);

    if (waitKey(5) >= 0)
      break;
  }

  return 0;
}